

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef(QuestionRef *this)

{
  bool bVar1;
  RpcConnectionState *pRVar2;
  Question **ppQVar3;
  NullableValue<kj::Exception> *other;
  Exception *pEVar4;
  anon_class_24_3_529c73a4 *func;
  Question local_3e0;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&> local_3b0;
  Promise<void> local_3a8;
  Exception *local_3a0;
  Exception *e;
  QuestionRef *local_390;
  Question *local_388;
  Maybe<kj::Exception> local_380;
  undefined1 local_1e8 [8];
  NullableValue<kj::Exception> _e2317;
  Fault local_48;
  undefined1 local_40 [16];
  Question *_kj_result;
  Question *question;
  Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *connectionState;
  Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *c;
  Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *_c2294;
  QuestionRef *this_local;
  
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00d8b880;
  _c2294 = (Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)this;
  c = kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState,decltype(nullptr)>
                (&this->connectionState);
  if ((Question *)c != (Question *)0x0) {
    question = (Question *)c;
    connectionState = c;
    pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->(c);
    anon_unknown_18::
    ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
              ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
               local_40,(int)pRVar2 + 0x248);
    local_40._8_8_ =
         kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Question>
                   ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> *)local_40);
    if ((Question *)local_40._8_8_ == (Question *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x8fa,FAILED,"connectionState->questions.find(id) != nullptr",
                 "\"Question ID no longer on table?\"",
                 (char (*) [32])"Question ID no longer on table?");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    ppQVar3 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Question*>
                        ((Question **)(local_40 + 8));
    _e2317.field_1.value.details.builder.disposer = (ArrayDisposer *)*ppQVar3;
    _kj_result = (Question *)_e2317.field_1.value.details.builder.disposer;
    pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)question
                       );
    bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
            is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar2->connection);
    if ((bVar1) && ((_kj_result->skipFinish & 1U) == 0)) {
      e = (Exception *)question;
      local_388 = _kj_result;
      local_390 = this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef()::_lambda()_1_>
                (&local_380,(kj *)&e,func);
      other = kj::_::readMaybe<kj::Exception>(&local_380);
      kj::_::NullableValue<kj::Exception>::NullableValue
                ((NullableValue<kj::Exception> *)local_1e8,other);
      kj::Maybe<kj::Exception>::~Maybe(&local_380);
      pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1e8);
      if (pEVar4 != (Exception *)0x0) {
        local_3a0 = kj::_::NullableValue<kj::Exception>::operator*
                              ((NullableValue<kj::Exception> *)local_1e8);
        pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                           ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                            question);
        pEVar4 = kj::mv<kj::Exception>(local_3a0);
        kj::Promise<void>::Promise(&local_3a8,pEVar4);
        kj::TaskSet::add(&pRVar2->tasks,&local_3a8);
        kj::Promise<void>::~Promise(&local_3a8);
      }
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1e8)
      ;
    }
    if ((_kj_result->isAwaitingReturn & 1U) == 0) {
      pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                          question);
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
                (&local_3e0,&pRVar2->questions,this->id,_kj_result);
      Question::~Question(&local_3e0);
      pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                          question);
      checkIfBecameIdle(pRVar2);
    }
    else {
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::Maybe(&local_3b0);
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::operator=
                (&_kj_result->selfRef,&local_3b0);
    }
  }
  kj::
  Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>_>
  ::~Maybe(&this->fulfiller);
  kj::Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>::~Maybe
            (&this->connectionState);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~QuestionRef() noexcept {
      // Contrary to KJ style, we declare this destructor `noexcept` because if anything in here
      // throws (without being caught) we're probably in pretty bad shape and going to be crashing
      // later anyway. Better to abort now.

      KJ_IF_SOME(c, connectionState) {
        auto& connectionState = c;

        auto& question = KJ_ASSERT_NONNULL(
            connectionState->questions.find(id), "Question ID no longer on table?");

        // Send the "Finish" message (if the connection is not already broken).
        if (connectionState->connection.is<Connected>() && !question.skipFinish) {
          KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
            auto message = connectionState->connection.get<Connected>().connection
                ->newOutgoingMessage(messageSizeHint<rpc::Finish>());
            auto builder = message->getBody().getAs<rpc::Message>().initFinish();
            builder.setQuestionId(id);
            // If we're still awaiting a return, then this request is being canceled, and we're going
            // to ignore any capabilities in the return message, so set releaseResultCaps true. If we
            // already received the return, then we've already built local proxies for the caps and
            // will send Release messages when those are destroyed.
            builder.setReleaseResultCaps(question.isAwaitingReturn);

            // Let the peer know we don't have the early cancellation bug.
            builder.setRequireEarlyCancellationWorkaround(false);

            message->send();
          })) {
            connectionState->tasks.add(kj::mv(e));
          }
        }

        // Check if the question has returned and, if so, remove it from the table.
        // Remove question ID from the table.  Must do this *after* sending `Finish` to ensure that
        // the ID is not re-allocated before the `Finish` message can be sent.
        if (question.isAwaitingReturn) {
          // Still waiting for return, so just remove the QuestionRef pointer from the table.
          question.selfRef = kj::none;
        } else {
          // Call has already returned, so we can now remove it from the table.
          connectionState->questions.erase(id, question);
          connectionState->checkIfBecameIdle();
        }
      }
    }